

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase223::run(TestCase223 *this)

{
  Builder BVar1;
  Fault f_1;
  Fault f;
  uint local_154;
  size_t local_150;
  Builder root;
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  root._builder._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Data>(&orphan,(Orphanage *)&root,2);
  BVar1 = OrphanBuilder::asData(&orphan.builder);
  root._builder.segment._0_4_ = 2;
  root._builder.capTable = (CapTableBuilder *)BVar1.super_ArrayPtr<unsigned_char>.size_;
  root._builder.data = anon_var_dwarf_b08b;
  root._builder.pointers = (WirePointer *)&DAT_00000005;
  root._builder.dataSize._0_1_ =
       (CapTableBuilder *)BVar1.super_ArrayPtr<unsigned_char>.size_ == (CapTableBuilder *)0x2;
  if (!(bool)(undefined1)root._builder.dataSize) {
    local_150 = CONCAT44(local_150._4_4_,2);
    BVar1 = OrphanBuilder::asData(&orphan.builder);
    f_1.exception = (Exception *)BVar1.super_ArrayPtr<unsigned_char>.size_;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0xe3,FAILED,"(2u) == (orphan.get().size())","_kjCondition,2u, orphan.get().size()",
               (DebugComparison<unsigned_int,_unsigned_long> *)&root,(uint *)&local_150,
               (unsigned_long *)&f_1);
    kj::_::Debug::Fault::fatal(&f);
  }
  BVar1 = OrphanBuilder::asData(&orphan.builder);
  *BVar1.super_ArrayPtr<unsigned_char>.ptr = '{';
  BVar1 = OrphanBuilder::asData(&orphan.builder);
  BVar1.super_ArrayPtr<unsigned_char>.ptr[1] = '-';
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField(&root,&orphan);
  BVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField(&root);
  f.exception._0_4_ = 2;
  if (BVar1.super_ArrayPtr<unsigned_char>.size_ == 2) {
    BVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField(&root);
    f.exception._0_4_ = 0x7b;
    if ((*BVar1.super_ArrayPtr<unsigned_char>.ptr != '{') && (kj::_::Debug::minSeverity < 3)) {
      f_1.exception._0_4_ = 0x7b;
      BVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField(&root);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(123u) == (root.getDataField()[0])\", _kjCondition, 123u, root.getDataField()[0]"
                 ,(char (*) [52])"failed: expected (123u) == (root.getDataField()[0])",
                 (DebugComparison<unsigned_int,_unsigned_char_&> *)&f,(uint *)&f_1,
                 BVar1.super_ArrayPtr<unsigned_char>.ptr);
    }
    BVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField(&root);
    f.exception._0_4_ = 0x2d;
    if ((BVar1.super_ArrayPtr<unsigned_char>.ptr[1] != '-') && (kj::_::Debug::minSeverity < 3)) {
      f_1.exception._0_4_ = 0x2d;
      BVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField(&root);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(45u) == (root.getDataField()[1])\", _kjCondition, 45u, root.getDataField()[1]"
                 ,(char (*) [51])"failed: expected (45u) == (root.getDataField()[1])",
                 (DebugComparison<unsigned_int,_unsigned_char_&> *)&f,(uint *)&f_1,
                 BVar1.super_ArrayPtr<unsigned_char>.ptr + 1);
    }
    OrphanBuilder::~OrphanBuilder(&orphan.builder);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_154 = 2;
  BVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField(&root);
  local_150 = BVar1.super_ArrayPtr<unsigned_char>.size_;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&f_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xe9,FAILED,"(2u) == (root.getDataField().size())",
             "_kjCondition,2u, root.getDataField().size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)&f,&local_154,&local_150);
  kj::_::Debug::Fault::fatal(&f_1);
}

Assistant:

TEST(Orphans, OrphanageData) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphan<Data>(2);
  ASSERT_EQ(2u, orphan.get().size());
  orphan.get()[0] = 123;
  orphan.get()[1] = 45;

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
  ASSERT_EQ(2u, root.getDataField().size());
  EXPECT_EQ(123u, root.getDataField()[0]);
  EXPECT_EQ(45u, root.getDataField()[1]);
}